

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleoption.cpp
# Opt level: O0

void __thiscall QStyleOptionComboBox::QStyleOptionComboBox(QStyleOptionComboBox *this,int version)

{
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> QVar1;
  enum_type in_ESI;
  long in_RDI;
  enum_type in_stack_fffffffffffffff0;
  
  QStyleOptionComplex::QStyleOptionComplex
            ((QStyleOptionComplex *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
             (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  *(undefined1 *)(in_RDI + 0x48) = 0;
  QRect::QRect((QRect *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  *(undefined1 *)(in_RDI + 0x5c) = 1;
  QString::QString((QString *)0x41d60a);
  QIcon::QIcon((QIcon *)(in_RDI + 0x78));
  QSize::QSize((QSize *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  QVar1.super_QFlagsStorage<Qt::AlignmentFlag>.i =
       (QFlagsStorage<Qt::AlignmentFlag>)Qt::operator|(in_ESI,in_stack_fffffffffffffff0);
  ((QFlagsStorageHelper<Qt::AlignmentFlag,_4> *)(in_RDI + 0x88))->
  super_QFlagsStorage<Qt::AlignmentFlag> = QVar1.super_QFlagsStorage<Qt::AlignmentFlag>.i;
  return;
}

Assistant:

QStyleOptionComboBox::QStyleOptionComboBox(int version)
    : QStyleOptionComplex(version, SO_ComboBox), editable(false), frame(true)
{
}